

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::bitwiseIsEqual(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  uint uVar2;
  fltSemantics *__first2;
  bool bVar3;
  __equal<true> *this_00;
  byte bVar4;
  
  bVar3 = true;
  if (this != rhs) {
    __first2 = rhs->semantics;
    if (this->semantics == __first2) {
      bVar1 = this->field_0x12;
      bVar4 = bVar1 & 7;
      if ((bVar4 == (rhs->field_0x12 & 7)) && (((rhs->field_0x12 ^ bVar1) & 8) == 0)) {
        if ((bVar1 & 7) == 0) {
          return true;
        }
        if (bVar4 == 3) {
          return true;
        }
        if ((bVar4 == 3 || (bVar1 & 6) == 0) || (this->exponent == rhs->exponent)) {
          uVar2 = this->semantics->precision;
          if (uVar2 - 0x40 < 0xffffff80) {
            this_00 = (__equal<true> *)(this->significand).parts;
          }
          else {
            this_00 = (__equal<true> *)&this->significand;
          }
          if (0xffffff7f < __first2->precision - 0x40) {
            bVar3 = std::__equal<true>::equal<unsigned_long>
                              (this_00,(unsigned_long *)(this_00 + (ulong)(uVar2 + 0x40 >> 6) * 8),
                               &(rhs->significand).part,(unsigned_long *)__first2);
            return bVar3;
          }
          bVar3 = std::__equal<true>::equal<unsigned_long>
                            (this_00,(unsigned_long *)(this_00 + (ulong)(uVar2 + 0x40 >> 6) * 8),
                             (rhs->significand).parts,(unsigned_long *)__first2);
          return bVar3;
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IEEEFloat::bitwiseIsEqual(const IEEEFloat &rhs) const {
  if (this == &rhs)
    return true;
  if (semantics != rhs.semantics ||
      category != rhs.category ||
      sign != rhs.sign)
    return false;
  if (category==fcZero || category==fcInfinity)
    return true;

  if (isFiniteNonZero() && exponent != rhs.exponent)
    return false;

  return std::equal(significandParts(), significandParts() + partCount(),
                    rhs.significandParts());
}